

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

TimestepInfo * __thiscall
adios2::format::BP5Serializer::CloseTimestep
          (BP5Serializer *this,int timestep,bool forceCopyDeferred)

{
  bool bVar1;
  undefined4 uVar2;
  reference pp_Var3;
  undefined8 uVar4;
  BufferFFS *this_00;
  FFSBuffer Buf;
  void *pvVar5;
  byte in_CL;
  long *in_RSI;
  TimestepInfo *in_RDI;
  size_t *tmp;
  void *AttributeBlock_1;
  void *AttributeBlock;
  int size_3;
  MetaMetaInfoBlock Block_3;
  BufferFFS *AttrData;
  BufferFFS *Metadata;
  void *MetaDataBlock;
  BP5MetadataInfoStruct *MBase;
  size_t AttributeSize;
  size_t MetaDataSize;
  FFSBuffer AttributeEncodeBuffer;
  FFSBuffer MetaEncodeBuffer;
  int size_2;
  MetaMetaInfoBlock Block_2;
  _FMFormatBody *Format_2;
  iterator __end2;
  iterator __begin2;
  vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_> *__range2;
  int size_1;
  FMFormat Format_1;
  FMStructDescRec struct_list_1 [4];
  MetaMetaInfoBlock Block_1;
  int size;
  FMFormat Format;
  FMStructDescRec struct_list [20];
  MetaMetaInfoBlock Block;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  Formats;
  TimestepInfo *Ret;
  vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_> *in_stack_fffffffffffff9d8;
  TimestepInfo *in_stack_fffffffffffff9e0;
  BufferFFS *in_stack_fffffffffffff9e8;
  __shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffff9f0;
  size_t in_stack_fffffffffffffa18;
  BP5Serializer *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa28;
  string *in_stack_fffffffffffffa30;
  string *in_stack_fffffffffffffa38;
  BP5Serializer *in_stack_fffffffffffffa40;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_stack_fffffffffffffa78;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  undefined1 *local_538;
  int local_4f4;
  size_t local_4f0;
  long local_4e8;
  undefined8 local_4e0;
  long local_4d8;
  void *local_4d0;
  FFSBuffer local_4c8;
  BufferFFS *local_4c0;
  undefined1 local_4b1 [40];
  allocator local_489;
  string local_488 [39];
  allocator local_461;
  string local_460 [39];
  allocator local_439;
  string local_438 [32];
  FFSBuffer local_418;
  undefined8 local_410;
  undefined8 local_408;
  BufferFFS *local_400;
  undefined8 local_3f8;
  int local_3ec [3];
  long local_3e0;
  undefined8 local_3d8;
  long local_3d0;
  _FMFormatBody *local_3c8;
  _FMFormatBody **local_3c0;
  __normal_iterator<_FMFormatBody_**,_std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>_>
  local_3b8;
  long *local_3b0;
  int local_3a4;
  long local_3a0;
  char *local_398;
  long lStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  char *local_378;
  undefined1 *puStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  char *local_358;
  undefined1 *puStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *local_318;
  long local_310;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *local_308;
  long local_300;
  int local_2f4;
  long local_2f0;
  char *local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  undefined8 local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined4 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined4 local_288;
  undefined8 local_280;
  char *local_278;
  undefined8 local_270;
  undefined4 local_268;
  undefined8 local_260;
  char *local_258;
  undefined8 local_250;
  undefined4 local_248;
  undefined8 local_240;
  char *local_238;
  undefined8 local_230;
  undefined4 local_228;
  undefined8 local_220;
  char *local_218;
  undefined8 local_210;
  undefined4 local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  undefined8 local_1a0;
  char *local_198;
  undefined8 local_190;
  undefined4 local_188;
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_160;
  char *local_158;
  undefined8 local_150;
  undefined4 local_148;
  undefined8 local_140;
  char *local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined8 local_120;
  char *local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined1 auStack_d8 [128];
  undefined1 auStack_58 [8];
  undefined8 local_50;
  long local_48;
  undefined8 local_40;
  long local_38;
  byte local_15;
  
  local_15 = in_CL & 1;
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
            *)0xd14b39);
  if ((in_RSI[0x15] == 0) && ((int)in_RSI[0x13] != 0)) {
    local_2d8 = (char *)0x0;
    local_2d0 = 0;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2b8 = "complex4";
    local_2b0 = fcomplex_field_list;
    local_2a8 = 8;
    local_2a0 = 0;
    local_298 = "complex8";
    local_290 = dcomplex_field_list;
    local_288 = 0x10;
    local_280 = 0;
    local_278 = "MetaArray";
    local_270 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x240);
    local_268 = 0x38;
    local_260 = 0;
    local_258 = "MetaArrayOp";
    local_250 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x248);
    local_248 = 0x40;
    local_240 = 0;
    local_238 = "MetaArrayMM1";
    local_230 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x250);
    local_228 = 0x40;
    local_220 = 0;
    local_218 = "MetaArrayOpMM1";
    local_210 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 600);
    local_208 = 0x48;
    local_200 = 0;
    local_1f8 = "MetaArrayMM2";
    local_1f0 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x260);
    local_1e8 = 0x40;
    local_1e0 = 0;
    local_1d8 = "MetaArrayOpMM2";
    local_1d0 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x268);
    local_1c8 = 0x48;
    local_1c0 = 0;
    local_1b8 = "MetaArrayMM4";
    local_1b0 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x270);
    local_1a8 = 0x40;
    local_1a0 = 0;
    local_198 = "MetaArrayOpMM4";
    local_190 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x278);
    local_188 = 0x48;
    local_180 = 0;
    local_178 = "MetaArrayMM8";
    local_170 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x280);
    local_168 = 0x40;
    local_160 = 0;
    local_158 = "MetaArrayOpMM8";
    local_150 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x288);
    local_148 = 0x48;
    local_140 = 0;
    local_138 = "MetaArrayMM16";
    local_130 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x290);
    local_128 = 0x40;
    local_120 = 0;
    local_118 = "MetaArrayOpMM16";
    local_110 = *(undefined8 *)((long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x298);
    local_108 = 0x48;
    local_100 = 0;
    local_f8 = 0;
    local_f0 = 0;
    local_e8 = 0;
    local_e0 = 0;
    local_538 = auStack_d8;
    do {
      memset(local_538,0,0x20);
      local_538 = local_538 + 0x20;
    } while (local_538 != auStack_58);
    local_2d8 = "MetaData";
    local_2d0 = in_RSI[0x14];
    in_stack_fffffffffffffab4 = FMstruct_size_field_list(in_RSI[0x14],8);
    local_2c8 = in_stack_fffffffffffffab4;
    local_2f0 = register_data_format(in_RSI[0x12],&local_2d8);
    in_RSI[0x15] = local_2f0;
    local_50 = get_server_rep_FMformat(local_2f0,&local_2f4);
    local_48 = (long)local_2f4;
    local_40 = get_server_ID_FMformat(local_2f0,&local_2f4);
    local_38 = (long)local_2f4;
    std::
    vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ::push_back((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
  }
  if (((*(byte *)(in_RSI + 0x23) & 1) != 0) && (in_RSI[0x17] != 0)) {
    local_328 = 0;
    uStack_320 = 0;
    local_338 = 0;
    uStack_330 = 0;
    local_348 = 0x10;
    uStack_340 = 0;
    local_358 = "complex8";
    puStack_350 = dcomplex_field_list;
    local_368 = 8;
    uStack_360 = 0;
    local_378 = "complex4";
    puStack_370 = fcomplex_field_list;
    local_388 = 0;
    uStack_380 = 0;
    local_398 = "Attributes";
    lStack_390 = in_RSI[0x17];
    uVar2 = FMstruct_size_field_list(in_RSI[0x17],8);
    local_388._0_4_ = uVar2;
    local_3a0 = register_data_format(in_RSI[0x12],&local_398);
    in_RSI[0x18] = local_3a0;
    in_stack_fffffffffffffa80 =
         (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *)get_server_rep_FMformat(local_3a0,&local_3a4);
    local_310 = (long)local_3a4;
    local_318 = in_stack_fffffffffffffa80;
    in_stack_fffffffffffffa78 =
         (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *)get_server_ID_FMformat(local_3a0,&local_3a4);
    local_300 = (long)local_3a4;
    local_308 = in_stack_fffffffffffffa78;
    std::
    vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ::push_back((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
  }
  local_3b0 = in_RSI + 7;
  local_3b8._M_current =
       (_FMFormatBody **)
       std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>::begin
                 (in_stack_fffffffffffff9d8);
  local_3c0 = (_FMFormatBody **)
              std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>::end
                        (in_stack_fffffffffffff9d8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<_FMFormatBody_**,_std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>_>
                             *)in_stack_fffffffffffff9e0,
                            (__normal_iterator<_FMFormatBody_**,_std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>_>
                             *)in_stack_fffffffffffff9d8), bVar1) {
    pp_Var3 = __gnu_cxx::
              __normal_iterator<_FMFormatBody_**,_std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>_>
              ::operator*(&local_3b8);
    local_3c8 = *pp_Var3;
    local_3ec._4_8_ = get_server_rep_FMformat(local_3c8,local_3ec);
    local_3e0 = (long)local_3ec[0];
    local_3d8 = get_server_ID_FMformat(local_3c8,local_3ec);
    local_3d0 = (long)local_3ec[0];
    std::
    vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ::push_back((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
    __gnu_cxx::
    __normal_iterator<_FMFormatBody_**,_std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>_>
    ::operator++(&local_3b8);
  }
  std::vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>::clear
            ((vector<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_> *)0xd153c8);
  local_3f8 = create_FFSBuffer();
  local_400 = (BufferFFS *)0x0;
  local_408 = 0;
  local_410 = 0;
  local_418 = (FFSBuffer)in_RSI[0x22];
  if (in_RSI[0x25] == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_438,"Toolkit",&local_439);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_460,"format::BP5Serializer",&local_461);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_488,"CloseTimestep",&local_489);
    in_stack_fffffffffffffa40 = (BP5Serializer *)local_4b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_4b1 + 1),"without prior Init",(allocator *)in_stack_fffffffffffffa40
              );
    helper::Throw<std::logic_error>
              ((string *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,
               in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
               (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
    std::__cxx11::string::~string((string *)(local_4b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4b1);
    std::__cxx11::string::~string(local_488);
    std::allocator<char>::~allocator((allocator<char> *)&local_489);
    std::__cxx11::string::~string(local_460);
    std::allocator<char>::~allocator((allocator<char> *)&local_461);
    std::__cxx11::string::~string(local_438);
    std::allocator<char>::~allocator((allocator<char> *)&local_439);
  }
  DumpDeferredBlocks(in_stack_fffffffffffffa20,SUB81(in_stack_fffffffffffffa18 >> 0x38,0));
  uVar4 = (**(code **)(*(long *)in_RSI[0x25] + 0x20))((long *)in_RSI[0x25],0,0,in_RSI[5],1);
  *(undefined8 *)((long)local_418 + 0x10) = uVar4;
  *(long *)((long)local_418 + 0x10) = *(long *)((long)local_418 + 0x10) + in_RSI[0x29];
  ProcessDeferredMinMax(in_stack_fffffffffffffa40);
  CollectFinalShapeValues
            ((BP5Serializer *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  this_00 = (BufferFFS *)FFSencode(local_3f8,in_RSI[0x15],in_RSI[0x22],&local_408);
  local_4c0 = this_00;
  Buf = (FFSBuffer)operator_new(0x50);
  BufferFFS::BufferFFS(this_00,Buf,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  local_4d0 = (void *)0x0;
  local_4c8 = Buf;
  if (in_RSI[0x10] == 0) {
    if (((*(byte *)(in_RSI + 0x23) & 1) != 0) && (in_RSI[0x17] != 0)) {
      in_stack_fffffffffffff9e8 = (BufferFFS *)create_FFSBuffer();
      local_400 = in_stack_fffffffffffff9e8;
      in_stack_fffffffffffff9e0 =
           (TimestepInfo *)FFSencode(in_stack_fffffffffffff9e8,in_RSI[0x18],in_RSI[0x19],&local_410)
      ;
      pvVar5 = operator_new(0x50);
      BufferFFS::BufferFFS(this_00,Buf,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      local_4d0 = pvVar5;
    }
  }
  else {
    if (in_RSI[6] == 0) {
      in_stack_fffffffffffffa20 =
           (BP5Serializer *)
           register_data_format(in_RSI[0x12],(long)in_RSI + *(long *)(*in_RSI + -0x18) + 0x1c0);
      in_RSI[6] = (long)in_stack_fffffffffffffa20;
      in_RSI[0x18] = in_RSI[6];
      in_stack_fffffffffffffa18 = get_server_rep_FMformat(in_RSI[6],&local_4f4);
      local_4e8 = (long)local_4f4;
      local_4f0 = in_stack_fffffffffffffa18;
      local_4e0 = get_server_ID_FMformat(in_RSI[6],&local_4f4);
      local_4d8 = (long)local_4f4;
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::push_back((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                   *)in_stack_fffffffffffff9f0,(value_type *)in_stack_fffffffffffff9e8);
    }
    local_400 = (BufferFFS *)create_FFSBuffer();
    FFSencode(local_400,in_RSI[6],in_RSI[0x10],&local_410);
    pvVar5 = operator_new(0x50);
    BufferFFS::BufferFFS(this_00,Buf,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    local_4d0 = pvVar5;
    FMfree_var_rec_elements(in_RSI[6]);
    in_stack_fffffffffffff9f0 =
         (__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2> *)in_RSI[0x10];
    if (in_stack_fffffffffffff9f0 !=
        (__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2> *)0x0) {
      operator_delete(in_stack_fffffffffffff9f0);
    }
    in_RSI[0x10] = 0;
  }
  local_418 = local_4c8;
  uVar4 = *(undefined8 *)(local_4c8 + 8);
  *(undefined8 *)(local_4c8 + 8) = 0;
  if (in_RSI[0x15] != 0) {
    FMfree_var_rec_elements(in_RSI[0x15]);
  }
  if ((in_RSI[0x22] != 0) && (in_RSI[0x24] != 0)) {
    memset((void *)in_RSI[0x22],0,in_RSI[0x24]);
  }
  *(undefined8 *)(local_418 + 8) = uVar4;
  *(undefined1 *)(in_RSI + 0x23) = 0;
  TimestepInfo::TimestepInfo(in_stack_fffffffffffff9e0);
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::operator=(in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<adios2::format::BufferFFS>(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  std::__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<adios2::format::BufferFFS>(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  in_RDI->DataBuffer = (BufferV *)in_RSI[0x25];
  in_RSI[0x25] = 0;
  if (in_RSI[0x17] != 0) {
    free_FMfield_list(in_RSI[0x17]);
    in_RSI[0x17] = 0;
  }
  *(undefined4 *)(in_RSI + 0x16) = 0;
  if (in_RSI[0x19] != 0) {
    free((void *)in_RSI[0x19]);
    in_RSI[0x19] = 0;
  }
  *(undefined4 *)(in_RSI + 0x1a) = 0;
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::~vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
             *)in_stack_fffffffffffff9f0);
  return in_RDI;
}

Assistant:

BP5Serializer::TimestepInfo BP5Serializer::CloseTimestep(int timestep, bool forceCopyDeferred)
{
    // EndStep()
    std::vector<MetaMetaInfoBlock> Formats;
    if (!Info.MetaFormat && Info.MetaFieldCount)
    {
        MetaMetaInfoBlock Block;
        FMStructDescRec struct_list[20] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {"MetaArray", MetaArrayRecListPtr, sizeof(MetaArrayRec), NULL},
            {"MetaArrayOp", MetaArrayRecOperatorListPtr, sizeof(MetaArrayRecOperator), NULL},
            {"MetaArrayMM1", MetaArrayRecMM1ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM1", MetaArrayRecOperatorMM1ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM2", MetaArrayRecMM2ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM2", MetaArrayRecOperatorMM2ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM4", MetaArrayRecMM4ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM4", MetaArrayRecOperatorMM4ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM8", MetaArrayRecMM8ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM8", MetaArrayRecOperatorMM8ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM16", MetaArrayRecMM16ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM16", MetaArrayRecOperatorMM16ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "MetaData";
        struct_list[0].field_list = Info.MetaFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info.MetaFields, sizeof(char *));

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);

        Info.MetaFormat = Format;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    if (NewAttribute && Info.AttributeFields)
    {
        MetaMetaInfoBlock Block;
        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "Attributes";
        struct_list[0].field_list = Info.AttributeFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info.AttributeFields, sizeof(char *));

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);
        Info.AttributeFormat = Format;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    for (auto Format : NewStructFormats)
    {
        MetaMetaInfoBlock Block;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    NewStructFormats.clear();

    // Encode Metadata and Data to create contiguous data blocks
    FFSBuffer MetaEncodeBuffer = create_FFSBuffer();
    FFSBuffer AttributeEncodeBuffer = NULL;
    size_t MetaDataSize = 0;
    size_t AttributeSize = 0;
    struct BP5MetadataInfoStruct *MBase = (struct BP5MetadataInfoStruct *)MetadataBuf;

    if (CurDataBuffer == NULL)
    {
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "CloseTimestep",
                                        "without prior Init");
    }

    //  Dump data for externs into iovec
    DumpDeferredBlocks(forceCopyDeferred);

    MBase->DataBlockSize =
        CurDataBuffer->AddToVec(0, NULL, m_BufferBlockSize, true); //  output block size aligned

    MBase->DataBlockSize += m_PriorDataBufferSizeTotal;

    ProcessDeferredMinMax();

    CollectFinalShapeValues();

    void *MetaDataBlock = FFSencode(MetaEncodeBuffer, Info.MetaFormat, MetadataBuf, &MetaDataSize);
    BufferFFS *Metadata = new BufferFFS(MetaEncodeBuffer, MetaDataBlock, MetaDataSize);

    BufferFFS *AttrData = NULL;

    if (PendingAttrs)
    {
        if (!GenericAttributeFormat)
        {
            MetaMetaInfoBlock Block;
            GenericAttributeFormat =
                register_data_format(Info.LocalFMContext, &attr_struct_list[0]);
            Info.AttributeFormat = GenericAttributeFormat;
            int size;
            Block.MetaMetaInfo = get_server_rep_FMformat(GenericAttributeFormat, &size);
            Block.MetaMetaInfoLen = size;
            Block.MetaMetaID = get_server_ID_FMformat(GenericAttributeFormat, &size);
            Block.MetaMetaIDLen = size;
            Formats.push_back(Block);
        }
        AttributeEncodeBuffer = create_FFSBuffer();
        void *AttributeBlock =
            FFSencode(AttributeEncodeBuffer, GenericAttributeFormat, PendingAttrs, &AttributeSize);
        AttrData = new BufferFFS(AttributeEncodeBuffer, AttributeBlock, AttributeSize);
        //	FMdump_encoded_data(GenericAttributeFormat, AttributeBlock,
        // 1024000);
        FMfree_var_rec_elements(GenericAttributeFormat, PendingAttrs);
        delete (PendingAttrs);
        PendingAttrs = nullptr;
    }
    else
    {
        // old way of doing attributes
        if (NewAttribute && Info.AttributeFields)
        {
            AttributeEncodeBuffer = create_FFSBuffer();
            void *AttributeBlock = FFSencode(AttributeEncodeBuffer, Info.AttributeFormat,
                                             Info.AttributeData, &AttributeSize);
            AttrData = new BufferFFS(AttributeEncodeBuffer, AttributeBlock, AttributeSize);
        }
    }

    // FMdump_encoded_data(Info.MetaFormat, MetaDataBlock, 1024000);
    /* free all those copied dimensions, etc */
    MBase = (struct BP5MetadataInfoStruct *)Metadata;
    size_t *tmp = MBase->BitField;
    /*
     * BitField value is saved away from FMfree_var_rec_elements() so that it
     * isn't unnecessarily free'd.
     */
    MBase->BitField = NULL;
    if (Info.MetaFormat)
        FMfree_var_rec_elements(Info.MetaFormat, MetadataBuf);
    if (MetadataBuf && MetadataSize)
        memset(MetadataBuf, 0, MetadataSize);
    MBase->BitField = tmp;
    NewAttribute = false;

    struct TimestepInfo Ret;
    Ret.NewMetaMetaBlocks = Formats;
    Ret.MetaEncodeBuffer.reset(Metadata);
    Ret.AttributeEncodeBuffer.reset(AttrData);
    Ret.DataBuffer = CurDataBuffer;
    CurDataBuffer = NULL;

    if (Info.AttributeFields)
    {
        free_FMfield_list(Info.AttributeFields);
        Info.AttributeFields = NULL;
    }
    Info.AttributeFieldCount = 0;

    if (Info.AttributeData)
    {
        free(Info.AttributeData);
        Info.AttributeData = NULL;
    }
    Info.AttributeSize = 0;

    return Ret;
}